

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

metasize_t btree_read_meta(btree *btree,void *buf)

{
  voidref addr_00;
  bnode *pbVar1;
  void *in_RSI;
  btree *in_RDI;
  bnode *node;
  metasize_t size;
  void *ptr;
  void *addr;
  ushort local_22;
  
  addr_00 = (*in_RDI->blk_ops->blk_read)(in_RDI->blk_handle,in_RDI->root_bid);
  pbVar1 = _fetch_bnode(in_RDI,addr_00,in_RDI->height);
  if ((pbVar1->flag & 2) == 0) {
    local_22 = 0;
  }
  else {
    local_22 = pbVar1[1].kvsize >> 8 | pbVar1[1].kvsize << 8;
    memcpy(in_RSI,&pbVar1[1].flag,(ulong)local_22);
  }
  return local_22;
}

Assistant:

metasize_t btree_read_meta(struct btree *btree, void *buf)
{
    void *addr;
    void *ptr;
    metasize_t size;
    struct bnode *node;

    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    node = _fetch_bnode(btree, addr, btree->height);
    if (node->flag & BNODE_MASK_METADATA) {
        ptr = ((uint8_t *)node) + sizeof(struct bnode);
        memcpy(&size, (uint8_t *)ptr, sizeof(metasize_t));
        size = _endian_decode(size);
        memcpy(buf, (uint8_t *)ptr + sizeof(metasize_t), size);
    } else {
        size = 0;
    }

    return size;
}